

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_logger.cpp
# Opt level: O0

void juzzlin::SimpleLogger::setLevelSymbol(Level level,string *symbol)

{
  string *in_RSI;
  Level in_EDI;
  string *in_stack_ffffffffffffffa8;
  string local_30 [48];
  
  std::__cxx11::string::string(local_30,in_RSI);
  Impl::setLevelSymbol(in_EDI,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void SimpleLogger::setLevelSymbol(Level level, std::string symbol)
{
    Impl::setLevelSymbol(level, symbol);
}